

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

LineTable * __thiscall llvm::DWARFDebugLine::getLineTable(DWARFDebugLine *this,uint64_t Offset)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  LineTableConstIter Pos;
  uint64_t Offset_local;
  DWARFDebugLine *this_local;
  
  Pos._M_node = (_Base_ptr)Offset;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_llvm::DWARFDebugLine::LineTable,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>_>
       ::find(&this->LineTableMap,(key_type_conflict *)&Pos);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_llvm::DWARFDebugLine::LineTable,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>_>
       ::end(&this->LineTableMap);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>
             ::operator->(&local_28);
    this_local = (DWARFDebugLine *)&ppVar2->second;
  }
  else {
    this_local = (DWARFDebugLine *)0x0;
  }
  return (LineTable *)this_local;
}

Assistant:

const DWARFDebugLine::LineTable *
DWARFDebugLine::getLineTable(uint64_t Offset) const {
  LineTableConstIter Pos = LineTableMap.find(Offset);
  if (Pos != LineTableMap.end())
    return &Pos->second;
  return nullptr;
}